

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall
GEO::Cavity::new_facet
          (Cavity *this,index_t tglobal,index_t boundary_f,signed_index_t v0,signed_index_t v1,
          signed_index_t v2)

{
  byte f;
  local_index_t new_t;
  signed_index_t v2_local;
  signed_index_t v1_local;
  signed_index_t v0_local;
  index_t boundary_f_local;
  index_t tglobal_local;
  Cavity *this_local;
  
  if ((this->OK_ & 1U) != 0) {
    f = (byte)this->nb_f_;
    if (this->nb_f_ == 0x80) {
      this->OK_ = false;
    }
    else {
      set_vv2t(this,v0,v1,f);
      set_vv2t(this,v1,v2,f);
      set_vv2t(this,v2,v0,f);
      if ((this->OK_ & 1U) != 0) {
        this->nb_f_ = this->nb_f_ + 1;
        this->tglobal_[f] = tglobal;
        this->boundary_f_[f] = boundary_f;
        this->f2v_[f][0] = v0;
        this->f2v_[f][1] = v1;
        this->f2v_[f][2] = v2;
      }
    }
  }
  return;
}

Assistant:

void new_facet(
	    index_t tglobal, index_t boundary_f,
	    signed_index_t v0, signed_index_t v1, signed_index_t v2
	) {
	    if(!OK_) {
		return;
	    }
	    
	    geo_debug_assert(v0 != v1);
	    geo_debug_assert(v1 != v2);
	    geo_debug_assert(v2 != v0);	    

	    local_index_t new_t = local_index_t(nb_f_);
	    
	    if(nb_f_ == MAX_F) {
		OK_ = false;
		return;
	    }
	    
	    set_vv2t(v0, v1, new_t);
	    set_vv2t(v1, v2, new_t);
	    set_vv2t(v2, v0, new_t);
	    
	    if(!OK_) {
		return;
	    }
	    
	    ++nb_f_;
	    tglobal_[new_t] = tglobal;
	    boundary_f_[new_t] = boundary_f;
	    f2v_[new_t][0] = v0;
	    f2v_[new_t][1] = v1;
	    f2v_[new_t][2] = v2;
	}